

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  RayHitK<4> *pRVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined8 uVar10;
  Ref<embree::Geometry> *pRVar11;
  Geometry *pGVar12;
  RayHitK<4> *pRVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 (*pauVar33) [16];
  byte bVar34;
  int iVar35;
  int iVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [16];
  ulong uVar45;
  long lVar46;
  RayHitK<4> *pRVar47;
  ulong uVar48;
  float fVar49;
  uint uVar50;
  float fVar51;
  float fVar61;
  float fVar64;
  vint4 bi;
  uint uVar62;
  uint uVar65;
  float fVar67;
  uint uVar68;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar63;
  float fVar66;
  float fVar69;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar70;
  float fVar72;
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  int iVar76;
  float fVar80;
  int iVar81;
  float fVar82;
  int iVar83;
  vint4 bi_1;
  float fVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar85;
  float fVar93;
  float fVar95;
  vint4 ai;
  uint uVar86;
  uint uVar94;
  uint uVar96;
  float fVar97;
  uint uVar98;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar100;
  float fVar104;
  float fVar106;
  vint4 ai_1;
  undefined1 auVar101 [16];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar110;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1128;
  undefined8 local_1118;
  undefined1 local_10d8 [3] [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  ulong uVar39;
  
  pauVar44 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar9 = (tray->tnear).field_0.i[k];
  iVar36 = (tray->tfar).field_0.i[k];
  iVar83 = iVar36;
  iVar81 = iVar36;
  iVar76 = iVar36;
LAB_0024dab1:
  do {
    pauVar33 = pauVar44 + -1;
    pauVar44 = pauVar44 + -1;
    if (*(float *)((long)*pauVar33 + 8) < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)((long)*pauVar33 + 8) == *(float *)(ray + k * 4 + 0x80)) {
      pRVar47 = *(RayHitK<4> **)*pauVar44;
      pRVar13 = ray;
      while (((ulong)pRVar47 & 8) == 0) {
        pRVar1 = pRVar47 + uVar40 + 0x20;
        fVar49 = (*(float *)pRVar1 - fVar3) * fVar6;
        fVar61 = (*(float *)(pRVar1 + 4) - fVar3) * fVar6;
        fVar64 = (*(float *)(pRVar1 + 8) - fVar3) * fVar6;
        fVar67 = (*(float *)(pRVar1 + 0xc) - fVar3) * fVar6;
        pRVar1 = pRVar47 + uVar42 + 0x20;
        fVar85 = (*(float *)pRVar1 - fVar4) * fVar7;
        fVar93 = (*(float *)(pRVar1 + 4) - fVar4) * fVar7;
        fVar95 = (*(float *)(pRVar1 + 8) - fVar4) * fVar7;
        fVar97 = (*(float *)(pRVar1 + 0xc) - fVar4) * fVar7;
        uVar86 = (uint)((int)fVar85 < (int)fVar49) * (int)fVar49 |
                 (uint)((int)fVar85 >= (int)fVar49) * (int)fVar85;
        uVar94 = (uint)((int)fVar93 < (int)fVar61) * (int)fVar61 |
                 (uint)((int)fVar93 >= (int)fVar61) * (int)fVar93;
        uVar96 = (uint)((int)fVar95 < (int)fVar64) * (int)fVar64 |
                 (uint)((int)fVar95 >= (int)fVar64) * (int)fVar95;
        uVar98 = (uint)((int)fVar97 < (int)fVar67) * (int)fVar67 |
                 (uint)((int)fVar97 >= (int)fVar67) * (int)fVar97;
        pRVar1 = pRVar47 + uVar43 + 0x20;
        fVar49 = (*(float *)pRVar1 - fVar5) * fVar8;
        fVar61 = (*(float *)(pRVar1 + 4) - fVar5) * fVar8;
        fVar64 = (*(float *)(pRVar1 + 8) - fVar5) * fVar8;
        fVar67 = (*(float *)(pRVar1 + 0xc) - fVar5) * fVar8;
        uVar50 = (uint)((int)fVar49 < iVar9) * iVar9 | (uint)((int)fVar49 >= iVar9) * (int)fVar49;
        uVar62 = (uint)((int)fVar61 < iVar9) * iVar9 | (uint)((int)fVar61 >= iVar9) * (int)fVar61;
        uVar65 = (uint)((int)fVar64 < iVar9) * iVar9 | (uint)((int)fVar64 >= iVar9) * (int)fVar64;
        uVar68 = (uint)((int)fVar67 < iVar9) * iVar9 | (uint)((int)fVar67 >= iVar9) * (int)fVar67;
        local_1038._0_4_ =
             ((int)uVar50 < (int)uVar86) * uVar86 | ((int)uVar50 >= (int)uVar86) * uVar50;
        local_1038._4_4_ =
             ((int)uVar62 < (int)uVar94) * uVar94 | ((int)uVar62 >= (int)uVar94) * uVar62;
        local_1038._8_4_ =
             ((int)uVar65 < (int)uVar96) * uVar96 | ((int)uVar65 >= (int)uVar96) * uVar65;
        local_1038._12_4_ =
             ((int)uVar68 < (int)uVar98) * uVar98 | ((int)uVar68 >= (int)uVar98) * uVar68;
        pRVar1 = pRVar47 + (uVar40 ^ 0x10) + 0x20;
        fVar49 = (*(float *)pRVar1 - fVar3) * fVar6;
        fVar61 = (*(float *)(pRVar1 + 4) - fVar3) * fVar6;
        fVar64 = (*(float *)(pRVar1 + 8) - fVar3) * fVar6;
        fVar67 = (*(float *)(pRVar1 + 0xc) - fVar3) * fVar6;
        pRVar1 = pRVar47 + (uVar42 ^ 0x10) + 0x20;
        fVar85 = (*(float *)pRVar1 - fVar4) * fVar7;
        fVar93 = (*(float *)(pRVar1 + 4) - fVar4) * fVar7;
        fVar95 = (*(float *)(pRVar1 + 8) - fVar4) * fVar7;
        fVar97 = (*(float *)(pRVar1 + 0xc) - fVar4) * fVar7;
        uVar86 = (uint)((int)fVar49 < (int)fVar85) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar85) * (int)fVar85;
        uVar94 = (uint)((int)fVar61 < (int)fVar93) * (int)fVar61 |
                 (uint)((int)fVar61 >= (int)fVar93) * (int)fVar93;
        uVar96 = (uint)((int)fVar64 < (int)fVar95) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar95) * (int)fVar95;
        uVar98 = (uint)((int)fVar67 < (int)fVar97) * (int)fVar67 |
                 (uint)((int)fVar67 >= (int)fVar97) * (int)fVar97;
        pRVar1 = pRVar47 + (uVar43 ^ 0x10) + 0x20;
        fVar49 = (*(float *)pRVar1 - fVar5) * fVar8;
        fVar61 = (*(float *)(pRVar1 + 4) - fVar5) * fVar8;
        fVar64 = (*(float *)(pRVar1 + 8) - fVar5) * fVar8;
        fVar67 = (*(float *)(pRVar1 + 0xc) - fVar5) * fVar8;
        uVar50 = (uint)(iVar76 < (int)fVar49) * iVar76 | (uint)(iVar76 >= (int)fVar49) * (int)fVar49
        ;
        uVar62 = (uint)(iVar81 < (int)fVar61) * iVar81 | (uint)(iVar81 >= (int)fVar61) * (int)fVar61
        ;
        uVar65 = (uint)(iVar83 < (int)fVar64) * iVar83 | (uint)(iVar83 >= (int)fVar64) * (int)fVar64
        ;
        uVar68 = (uint)(iVar36 < (int)fVar67) * iVar36 | (uint)(iVar36 >= (int)fVar67) * (int)fVar67
        ;
        auVar88._0_4_ =
             -(uint)((int)(((int)uVar86 < (int)uVar50) * uVar86 |
                          ((int)uVar86 >= (int)uVar50) * uVar50) < (int)local_1038._0_4_);
        auVar88._4_4_ =
             -(uint)((int)(((int)uVar94 < (int)uVar62) * uVar94 |
                          ((int)uVar94 >= (int)uVar62) * uVar62) < (int)local_1038._4_4_);
        auVar88._8_4_ =
             -(uint)((int)(((int)uVar96 < (int)uVar65) * uVar96 |
                          ((int)uVar96 >= (int)uVar65) * uVar65) < (int)local_1038._8_4_);
        auVar88._12_4_ =
             -(uint)((int)(((int)uVar98 < (int)uVar68) * uVar98 |
                          ((int)uVar98 >= (int)uVar68) * uVar68) < (int)local_1038._12_4_);
        iVar35 = movmskps((int)pRVar13,auVar88);
        if (iVar35 == 0xf) {
          if (pauVar44 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          goto LAB_0024dab1;
        }
        bVar34 = (byte)iVar35 ^ 0xf;
        uVar45 = (ulong)pRVar47 & 0xfffffffffffffff0;
        pRVar13 = (RayHitK<4> *)0x0;
        if (bVar34 != 0) {
          for (; (bVar34 >> (long)pRVar13 & 1) == 0; pRVar13 = pRVar13 + 1) {
          }
        }
        pRVar47 = *(RayHitK<4> **)(uVar45 + (long)pRVar13 * 8);
        uVar50 = bVar34 - 1 & (uint)bVar34;
        if (uVar50 != 0) {
          uVar62 = *(uint *)(local_1038 + (long)pRVar13 * 4);
          lVar46 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
            }
          }
          pRVar13 = *(RayHitK<4> **)(uVar45 + lVar46 * 8);
          uVar65 = *(uint *)(local_1038 + lVar46 * 4);
          uVar50 = uVar50 - 1 & uVar50;
          if (uVar50 == 0) {
            if (uVar62 < uVar65) {
              *(RayHitK<4> **)*pauVar44 = pRVar13;
              *(uint *)((long)*pauVar44 + 8) = uVar65;
              pauVar44 = pauVar44 + 1;
            }
            else {
              *(RayHitK<4> **)*pauVar44 = pRVar47;
              *(uint *)((long)*pauVar44 + 8) = uVar62;
              pauVar44 = pauVar44 + 1;
              pRVar47 = pRVar13;
            }
          }
          else {
            auVar89._8_4_ = uVar62;
            auVar89._0_8_ = pRVar47;
            auVar89._12_4_ = 0;
            auVar101._8_4_ = uVar65;
            auVar101._0_8_ = pRVar13;
            auVar101._12_4_ = 0;
            lVar46 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            uVar10 = *(undefined8 *)(uVar45 + lVar46 * 8);
            iVar35 = *(int *)(local_1038 + lVar46 * 4);
            auVar117._8_4_ = iVar35;
            auVar117._0_8_ = uVar10;
            auVar117._12_4_ = 0;
            auVar112._8_4_ = -(uint)((int)uVar62 < (int)uVar65);
            uVar50 = uVar50 - 1 & uVar50;
            if (uVar50 == 0) {
              auVar112._4_4_ = auVar112._8_4_;
              auVar112._0_4_ = auVar112._8_4_;
              auVar112._12_4_ = auVar112._8_4_;
              auVar71._8_4_ = uVar65;
              auVar71._0_8_ = pRVar13;
              auVar71._12_4_ = 0;
              auVar88 = blendvps(auVar71,auVar89,auVar112);
              auVar89 = blendvps(auVar89,auVar101,auVar112);
              auVar52._8_4_ = -(uint)(auVar88._8_4_ < iVar35);
              auVar52._4_4_ = auVar52._8_4_;
              auVar52._0_4_ = auVar52._8_4_;
              auVar52._12_4_ = auVar52._8_4_;
              auVar111._8_4_ = iVar35;
              auVar111._0_8_ = uVar10;
              auVar111._12_4_ = 0;
              auVar112 = blendvps(auVar111,auVar88,auVar52);
              auVar88 = blendvps(auVar88,auVar117,auVar52);
              auVar53._8_4_ = -(uint)(auVar89._8_4_ < auVar88._8_4_);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar101 = blendvps(auVar88,auVar89,auVar53);
              auVar88 = blendvps(auVar89,auVar88,auVar53);
              *pauVar44 = auVar88;
              pauVar44[1] = auVar101;
              pRVar47 = auVar112._0_8_;
              pauVar44 = pauVar44 + 2;
              pRVar13 = (RayHitK<4> *)(ulong)uVar50;
            }
            else {
              pRVar13 = (RayHitK<4> *)0x0;
              if ((RayHitK<4> *)(ulong)uVar50 != (RayHitK<4> *)0x0) {
                for (; (uVar50 >> (long)pRVar13 & 1) == 0; pRVar13 = pRVar13 + 1) {
                }
              }
              auVar54._4_4_ = auVar112._8_4_;
              auVar54._0_4_ = auVar112._8_4_;
              auVar54._8_4_ = auVar112._8_4_;
              auVar54._12_4_ = auVar112._8_4_;
              auVar88 = blendvps(auVar101,auVar89,auVar54);
              auVar89 = blendvps(auVar89,auVar101,auVar54);
              auVar116._8_4_ = *(int *)(local_1038 + (long)pRVar13 * 4);
              auVar116._0_8_ = *(undefined8 *)(uVar45 + (long)pRVar13 * 8);
              auVar116._12_4_ = 0;
              auVar55._8_4_ = -(uint)(iVar35 < *(int *)(local_1038 + (long)pRVar13 * 4));
              auVar55._4_4_ = auVar55._8_4_;
              auVar55._0_4_ = auVar55._8_4_;
              auVar55._12_4_ = auVar55._8_4_;
              auVar112 = blendvps(auVar116,auVar117,auVar55);
              auVar101 = blendvps(auVar117,auVar116,auVar55);
              auVar56._8_4_ = -(uint)(auVar89._8_4_ < auVar101._8_4_);
              auVar56._4_4_ = auVar56._8_4_;
              auVar56._0_4_ = auVar56._8_4_;
              auVar56._12_4_ = auVar56._8_4_;
              auVar117 = blendvps(auVar101,auVar89,auVar56);
              auVar89 = blendvps(auVar89,auVar101,auVar56);
              auVar57._8_4_ = -(uint)(auVar88._8_4_ < auVar112._8_4_);
              auVar57._4_4_ = auVar57._8_4_;
              auVar57._0_4_ = auVar57._8_4_;
              auVar57._12_4_ = auVar57._8_4_;
              auVar101 = blendvps(auVar112,auVar88,auVar57);
              auVar88 = blendvps(auVar88,auVar112,auVar57);
              auVar58._8_4_ = -(uint)(auVar88._8_4_ < auVar117._8_4_);
              auVar58._4_4_ = auVar58._8_4_;
              auVar58._0_4_ = auVar58._8_4_;
              auVar58._12_4_ = auVar58._8_4_;
              auVar112 = blendvps(auVar117,auVar88,auVar58);
              auVar88 = blendvps(auVar88,auVar117,auVar58);
              *pauVar44 = auVar89;
              pauVar44[1] = auVar88;
              pauVar44[2] = auVar112;
              pRVar47 = auVar101._0_8_;
              pauVar44 = pauVar44 + 3;
            }
          }
        }
      }
      uVar45 = (ulong)((uint)pRVar47 & 0xf);
      if (uVar45 != 8) {
        uVar48 = (ulong)pRVar47 & 0xfffffffffffffff0;
        local_1078 = *(float *)(ray + k * 4);
        local_1088 = *(float *)(ray + k * 4 + 0x10);
        local_1098 = *(float *)(ray + k * 4 + 0x20);
        fVar49 = *(float *)(ray + k * 4 + 0x40);
        fVar61 = *(float *)(ray + k * 4 + 0x50);
        local_10a8 = *(float *)(ray + k * 4 + 0x60);
        lVar46 = 0;
        pRVar47 = ray;
        fStack_10a4 = local_10a8;
        fStack_10a0 = local_10a8;
        fStack_109c = local_10a8;
        fStack_1094 = local_1098;
        fStack_1090 = local_1098;
        fStack_108c = local_1098;
        fStack_1084 = local_1088;
        fStack_1080 = local_1088;
        fStack_107c = local_1088;
        fStack_1074 = local_1078;
        fStack_1070 = local_1078;
        fStack_106c = local_1078;
        do {
          lVar41 = lVar46 * 0xb0;
          pfVar2 = (float *)(uVar48 + 0x80 + lVar41);
          fVar64 = *pfVar2;
          fVar67 = pfVar2[1];
          fVar85 = pfVar2[2];
          fVar93 = pfVar2[3];
          pfVar2 = (float *)(uVar48 + 0x40 + lVar41);
          fVar95 = *pfVar2;
          fVar97 = pfVar2[1];
          fVar110 = pfVar2[2];
          fVar113 = pfVar2[3];
          pfVar2 = (float *)(uVar48 + 0x70 + lVar41);
          fVar114 = *pfVar2;
          fVar115 = pfVar2[1];
          fVar19 = pfVar2[2];
          fVar20 = pfVar2[3];
          pfVar2 = (float *)(uVar48 + 0x50 + lVar41);
          fVar21 = *pfVar2;
          fVar22 = pfVar2[1];
          fVar23 = pfVar2[2];
          fVar24 = pfVar2[3];
          fVar99 = fVar114 * fVar21 - fVar64 * fVar95;
          fVar104 = fVar115 * fVar22 - fVar67 * fVar97;
          fVar106 = fVar19 * fVar23 - fVar85 * fVar110;
          fVar108 = fVar20 * fVar24 - fVar93 * fVar113;
          local_1118 = CONCAT44(fVar104,fVar99);
          pfVar2 = (float *)(uVar48 + 0x60 + lVar41);
          fVar25 = *pfVar2;
          fVar26 = pfVar2[1];
          fVar27 = pfVar2[2];
          fVar28 = pfVar2[3];
          pfVar2 = (float *)(uVar48 + lVar41);
          fVar127 = *pfVar2 - local_1078;
          fVar130 = pfVar2[1] - fStack_1074;
          fVar133 = pfVar2[2] - fStack_1070;
          fVar136 = pfVar2[3] - fStack_106c;
          pfVar2 = (float *)(uVar48 + 0x10 + lVar41);
          fVar51 = *pfVar2 - local_1088;
          fVar63 = pfVar2[1] - fStack_1084;
          fVar66 = pfVar2[2] - fStack_1080;
          fVar69 = pfVar2[3] - fStack_107c;
          fVar100 = fVar61 * fVar127 - fVar49 * fVar51;
          fVar105 = fVar61 * fVar130 - fVar49 * fVar63;
          fVar107 = fVar61 * fVar133 - fVar49 * fVar66;
          fVar109 = fVar61 * fVar136 - fVar49 * fVar69;
          pfVar2 = (float *)(uVar48 + 0x20 + lVar41);
          fVar70 = *pfVar2 - local_1098;
          fVar72 = pfVar2[1] - fStack_1094;
          fVar73 = pfVar2[2] - fStack_1090;
          fVar74 = pfVar2[3] - fStack_108c;
          pfVar2 = (float *)(uVar48 + 0x30 + lVar41);
          fVar29 = *pfVar2;
          fVar30 = pfVar2[1];
          fVar31 = pfVar2[2];
          fVar32 = pfVar2[3];
          fVar119 = fVar64 * fVar29 - fVar21 * fVar25;
          fVar121 = fVar67 * fVar30 - fVar22 * fVar26;
          fVar123 = fVar85 * fVar31 - fVar23 * fVar27;
          fVar125 = fVar93 * fVar32 - fVar24 * fVar28;
          local_1128 = CONCAT44(fVar121,fVar119);
          fVar120 = fVar49 * fVar70 - fVar127 * local_10a8;
          fVar122 = fVar49 * fVar72 - fVar130 * fStack_10a4;
          fVar124 = fVar49 * fVar73 - fVar133 * fStack_10a0;
          fVar126 = fVar49 * fVar74 - fVar136 * fStack_109c;
          fVar128 = fVar95 * fVar25 - fVar114 * fVar29;
          fVar131 = fVar97 * fVar26 - fVar115 * fVar30;
          fVar134 = fVar110 * fVar27 - fVar19 * fVar31;
          fVar137 = fVar113 * fVar28 - fVar20 * fVar32;
          fVar75 = local_10a8 * fVar51 - fVar61 * fVar70;
          fVar80 = fStack_10a4 * fVar63 - fVar61 * fVar72;
          fVar82 = fStack_10a0 * fVar66 - fVar61 * fVar73;
          fVar84 = fStack_109c * fVar69 - fVar61 * fVar74;
          fVar129 = fVar99 * fVar49 + fVar119 * fVar61 + fVar128 * local_10a8;
          fVar132 = fVar104 * fVar49 + fVar121 * fVar61 + fVar131 * fStack_10a4;
          fVar135 = fVar106 * fVar49 + fVar123 * fVar61 + fVar134 * fStack_10a0;
          fVar138 = fVar108 * fVar49 + fVar125 * fVar61 + fVar137 * fStack_109c;
          uVar62 = (uint)fVar129 & 0x80000000;
          uVar65 = (uint)fVar132 & 0x80000000;
          uVar68 = (uint)fVar135 & 0x80000000;
          uVar86 = (uint)fVar138 & 0x80000000;
          fVar64 = (float)((uint)(fVar25 * fVar75 + fVar114 * fVar120 + fVar64 * fVar100) ^ uVar62);
          fVar67 = (float)((uint)(fVar26 * fVar80 + fVar115 * fVar122 + fVar67 * fVar105) ^ uVar65);
          local_1038._4_4_ = fVar67;
          local_1038._0_4_ = fVar64;
          fVar85 = (float)((uint)(fVar27 * fVar82 + fVar19 * fVar124 + fVar85 * fVar107) ^ uVar68);
          fVar93 = (float)((uint)(fVar28 * fVar84 + fVar20 * fVar126 + fVar93 * fVar109) ^ uVar86);
          local_1028 = (float)((uint)(fVar75 * fVar29 + fVar120 * fVar95 + fVar100 * fVar21) ^
                              uVar62);
          fStack_1024 = (float)((uint)(fVar80 * fVar30 + fVar122 * fVar97 + fVar105 * fVar22) ^
                               uVar65);
          fStack_1020 = (float)((uint)(fVar82 * fVar31 + fVar124 * fVar110 + fVar107 * fVar23) ^
                               uVar68);
          fStack_101c = (float)((uint)(fVar84 * fVar32 + fVar126 * fVar113 + fVar109 * fVar24) ^
                               uVar86);
          fVar95 = ABS(fVar129);
          fVar97 = ABS(fVar132);
          local_1008._0_8_ = CONCAT44(fVar132,fVar129) & 0x7fffffff7fffffff;
          local_1008._8_4_ = ABS(fVar135);
          local_1008._12_4_ = ABS(fVar138);
          bVar17 = fVar64 + local_1028 <= fVar95 &&
                   ((0.0 <= local_1028 && 0.0 <= fVar64) && fVar129 != 0.0);
          auVar87._0_4_ = -(uint)bVar17;
          bVar18 = fVar67 + fStack_1024 <= fVar97 &&
                   ((0.0 <= fStack_1024 && 0.0 <= fVar67) && fVar132 != 0.0);
          auVar87._4_4_ = -(uint)bVar18;
          bVar16 = fVar85 + fStack_1020 <= local_1008._8_4_ &&
                   ((0.0 <= fStack_1020 && 0.0 <= fVar85) && fVar135 != 0.0);
          auVar87._8_4_ = -(uint)bVar16;
          bVar15 = fVar93 + fStack_101c <= local_1008._12_4_ &&
                   ((0.0 <= fStack_101c && 0.0 <= fVar93) && fVar138 != 0.0);
          auVar87._12_4_ = -(uint)bVar15;
          uVar50 = movmskps((int)pRVar47,auVar87);
          pRVar47 = (RayHitK<4> *)(ulong)uVar50;
          if (uVar50 != 0) {
            local_1018._0_4_ =
                 (float)(uVar62 ^ (uint)(fVar127 * fVar99 + fVar51 * fVar119 + fVar70 * fVar128));
            local_1018._4_4_ =
                 (float)(uVar65 ^ (uint)(fVar130 * fVar104 + fVar63 * fVar121 + fVar72 * fVar131));
            local_1018._8_4_ =
                 (float)(uVar68 ^ (uint)(fVar133 * fVar106 + fVar66 * fVar123 + fVar73 * fVar134));
            local_1018._12_4_ =
                 (float)(uVar86 ^ (uint)(fVar136 * fVar108 + fVar69 * fVar125 + fVar74 * fVar137));
            fVar110 = *(float *)(ray + k * 4 + 0x30);
            fVar113 = *(float *)(ray + k * 4 + 0x80);
            local_10d8[0]._0_4_ =
                 -(uint)((local_1018._0_4_ <= fVar113 * fVar95 &&
                         fVar110 * fVar95 < local_1018._0_4_) && bVar17);
            local_10d8[0]._4_4_ =
                 -(uint)((local_1018._4_4_ <= fVar113 * fVar97 &&
                         fVar110 * fVar97 < local_1018._4_4_) && bVar18);
            local_10d8[0]._8_4_ =
                 -(uint)((local_1018._8_4_ <= fVar113 * local_1008._8_4_ &&
                         fVar110 * local_1008._8_4_ < local_1018._8_4_) && bVar16);
            local_10d8[0]._12_4_ =
                 -(uint)((local_1018._12_4_ <= fVar113 * local_1008._12_4_ &&
                         fVar110 * local_1008._12_4_ < local_1018._12_4_) && bVar15);
            uVar50 = movmskps((int)ray,local_10d8[0]);
            pRVar47 = (RayHitK<4> *)(ulong)uVar50;
            if (uVar50 != 0) {
              local_1038._8_4_ = fVar85;
              local_1038._12_4_ = fVar93;
              local_fe8 = local_10d8[0];
              local_fa8 = local_1118;
              uStack_fa0 = CONCAT44(fVar108,fVar106);
              local_f98 = local_1128;
              uStack_f90 = CONCAT44(fVar125,fVar123);
              local_f88._4_4_ = fVar131;
              local_f88._0_4_ = fVar128;
              local_f88._8_4_ = fVar134;
              local_f88._12_4_ = fVar137;
              auVar88 = rcpps(local_f88,local_1008);
              fVar110 = auVar88._0_4_;
              fVar113 = auVar88._4_4_;
              fVar114 = auVar88._8_4_;
              fVar115 = auVar88._12_4_;
              fVar110 = (1.0 - fVar95 * fVar110) * fVar110 + fVar110;
              fVar113 = (1.0 - fVar97 * fVar113) * fVar113 + fVar113;
              fVar114 = (1.0 - local_1008._8_4_ * fVar114) * fVar114 + fVar114;
              fVar115 = (1.0 - local_1008._12_4_ * fVar115) * fVar115 + fVar115;
              auVar118._0_4_ = local_1018._0_4_ * fVar110;
              auVar118._4_4_ = local_1018._4_4_ * fVar113;
              auVar118._8_4_ = local_1018._8_4_ * fVar114;
              auVar118._12_4_ = local_1018._12_4_ * fVar115;
              local_fb8 = auVar118;
              local_fd8[0] = fVar64 * fVar110;
              local_fd8[1] = fVar67 * fVar113;
              local_fd8[2] = fVar85 * fVar114;
              local_fd8[3] = fVar93 * fVar115;
              local_fc8._0_4_ = fVar110 * local_1028;
              local_fc8._4_4_ = fVar113 * fStack_1024;
              local_fc8._8_4_ = fVar114 * fStack_1020;
              local_fc8._12_4_ = fVar115 * fStack_101c;
              auVar89 = blendvps(_DAT_01f7a9f0,auVar118,local_10d8[0]);
              auVar102._4_4_ = auVar89._0_4_;
              auVar102._0_4_ = auVar89._4_4_;
              auVar102._8_4_ = auVar89._12_4_;
              auVar102._12_4_ = auVar89._8_4_;
              auVar88 = minps(auVar102,auVar89);
              auVar77._0_8_ = auVar88._8_8_;
              auVar77._8_4_ = auVar88._0_4_;
              auVar77._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar77,auVar88);
              uVar50 = -(uint)(auVar88._0_4_ == auVar89._0_4_);
              uVar62 = -(uint)(auVar88._4_4_ == auVar89._4_4_);
              uVar65 = -(uint)(auVar88._8_4_ == auVar89._8_4_);
              uVar68 = -(uint)(auVar88._12_4_ == auVar89._12_4_);
              auVar92._4_4_ = uVar62;
              auVar92._0_4_ = uVar50;
              auVar90._0_4_ = uVar50 & local_10d8[0]._0_4_;
              auVar90._4_4_ = uVar62 & local_10d8[0]._4_4_;
              auVar90._8_4_ = uVar65 & local_10d8[0]._8_4_;
              auVar90._12_4_ = uVar68 & local_10d8[0]._12_4_;
              iVar36 = movmskps((int)context,auVar90);
              auVar91._8_4_ = 0xffffffff;
              auVar91._0_8_ = 0xffffffffffffffff;
              auVar91._12_4_ = 0xffffffff;
              if (iVar36 != 0) {
                auVar92._8_4_ = uVar65;
                auVar92._12_4_ = uVar68;
                auVar91 = auVar92;
              }
              lVar41 = lVar41 + uVar48;
              auVar59._0_4_ = local_10d8[0]._0_4_ & auVar91._0_4_;
              auVar59._4_4_ = local_10d8[0]._4_4_ & auVar91._4_4_;
              auVar59._8_4_ = local_10d8[0]._8_4_ & auVar91._8_4_;
              auVar59._12_4_ = local_10d8[0]._12_4_ & auVar91._12_4_;
              uVar37 = movmskps(iVar36,auVar59);
              uVar39 = CONCAT44((int)((ulong)context >> 0x20),uVar37);
              lVar14 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              pRVar11 = (context->scene->geometries).items;
              uVar50 = *(uint *)(ray + k * 4 + 0x90);
              uVar62 = *(uint *)(lVar41 + 0x90 + lVar14 * 4);
              pGVar12 = pRVar11[uVar62].ptr;
              uVar65 = pGVar12->mask;
              while ((uVar65 & uVar50) == 0) {
                *(undefined4 *)(local_10d8[0] + lVar14 * 4) = 0;
                uVar37 = (undefined4)((ulong)pGVar12 >> 0x20);
                iVar36 = movmskps((int)pGVar12,local_10d8[0]);
                pRVar47 = (RayHitK<4> *)CONCAT44(uVar37,iVar36);
                if (iVar36 == 0) goto LAB_0024dff5;
                auVar89 = blendvps(_DAT_01f7a9f0,auVar118,local_10d8[0]);
                auVar103._4_4_ = auVar89._0_4_;
                auVar103._0_4_ = auVar89._4_4_;
                auVar103._8_4_ = auVar89._12_4_;
                auVar103._12_4_ = auVar89._8_4_;
                auVar88 = minps(auVar103,auVar89);
                auVar78._0_8_ = auVar88._8_8_;
                auVar78._8_4_ = auVar88._0_4_;
                auVar78._12_4_ = auVar88._4_4_;
                auVar88 = minps(auVar78,auVar88);
                auVar79._0_8_ =
                     CONCAT44(-(uint)(auVar88._4_4_ == auVar89._4_4_) & local_10d8[0]._4_4_,
                              -(uint)(auVar88._0_4_ == auVar89._0_4_) & local_10d8[0]._0_4_);
                auVar79._8_4_ = -(uint)(auVar88._8_4_ == auVar89._8_4_) & local_10d8[0]._8_4_;
                auVar79._12_4_ = -(uint)(auVar88._12_4_ == auVar89._12_4_) & local_10d8[0]._12_4_;
                iVar36 = movmskps(iVar36,auVar79);
                auVar60 = local_10d8[0];
                if (iVar36 != 0) {
                  auVar60._8_4_ = auVar79._8_4_;
                  auVar60._0_8_ = auVar79._0_8_;
                  auVar60._12_4_ = auVar79._12_4_;
                }
                uVar38 = movmskps(iVar36,auVar60);
                uVar39 = CONCAT44(uVar37,uVar38);
                lVar14 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar62 = *(uint *)(lVar41 + 0x90 + lVar14 * 4);
                pGVar12 = pRVar11[uVar62].ptr;
                uVar65 = pGVar12->mask;
              }
              fVar64 = local_fd8[lVar14];
              uVar37 = *(undefined4 *)(local_fc8 + lVar14 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + lVar14 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_fa8 + lVar14 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + lVar14 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_f88 + lVar14 * 4);
              *(float *)(ray + k * 4 + 0xf0) = fVar64;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar37;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar41 + 0xa0 + lVar14 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar62;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar50 = context->user->instPrimID[0];
              pRVar47 = (RayHitK<4> *)(ulong)uVar50;
              *(uint *)(ray + k * 4 + 0x140) = uVar50;
            }
          }
LAB_0024dff5:
          lVar46 = lVar46 + 1;
        } while (lVar46 != uVar45 - 8);
      }
      iVar76 = *(int *)(ray + k * 4 + 0x80);
      iVar81 = iVar76;
      iVar83 = iVar76;
      iVar36 = iVar76;
    }
    if (pauVar44 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }